

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall cmake::SetupDebugger(cmake *this,string *connection)

{
  char cVar1;
  bool bVar2;
  int port;
  cmDebugger *pcVar3;
  cmDebugServerConsole *this_00;
  
  if (this->Debugger == (cmDebugger *)0x0) {
    pcVar3 = cmDebugger::Create(this);
    this->Debugger = pcVar3;
    if (pcVar3 != (cmDebugger *)0x0) {
      bVar2 = std::operator==(connection,"stdin");
      if (bVar2) {
        this_00 = (cmDebugServerConsole *)operator_new(0x4a8);
        cmDebugServerConsole::cmDebugServerConsole(this_00,this->Debugger);
      }
      else {
        bVar2 = std::operator==(connection,"json-stdin");
        if (bVar2) {
          this_00 = (cmDebugServerConsole *)operator_new(0x4a0);
          cmDebugServerJson::cmDebugServerJson((cmDebugServerJson *)this_00,this->Debugger);
        }
        else {
          cVar1 = *(connection->_M_dataplus)._M_p;
          this_00 = (cmDebugServerConsole *)operator_new(0x4a0);
          pcVar3 = this->Debugger;
          if ((byte)(cVar1 - 0x30U) < 10) {
            port = std::__cxx11::stoi(connection,(size_t *)0x0,10);
            cmDebugServerJson::cmDebugServerJson((cmDebugServerJson *)this_00,pcVar3,port);
          }
          else {
            cmDebugServerJson::cmDebugServerJson((cmDebugServerJson *)this_00,pcVar3,connection);
          }
        }
      }
      (*this->Debugger->_vptr_cmDebugger[0x18])
                (this->Debugger,&(this_00->super_cmDebugServer).super_cmDebuggerListener);
      (*(this_00->super_cmDebugServer).super_cmServerBase._vptr_cmServerBase[5])(this_00);
      return;
    }
  }
  return;
}

Assistant:

void cmake::SetupDebugger(const std::string& connection)
{
  if (this->Debugger) {
    return;
  }

  this->Debugger = cmDebugger::Create(*this);

  if (this->Debugger) {
    cmDebugServer* server = CM_NULLPTR;
    if (connection == "stdin") {
      server = new cmDebugServerConsole(*this->Debugger);
    } else if (connection == "json-stdin") {
      server = new cmDebugServerJson(*this->Debugger);
    } else if (connection[0] >= '0' && connection[0] <= '9') {
      server = new cmDebugServerJson(*this->Debugger, std::stoi(connection));
    } else {
      server = new cmDebugServerJson(*this->Debugger, connection);
    }

    if (server) {
      this->Debugger->AddListener(server);
      server->StartServeThread();
    }
  }
}